

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_array_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint32_t count,
                      uint32_t size,AMQP_VALUE *items,_Bool use_smallest)

{
  int iVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  _Bool first_element;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t i;
  int result;
  _Bool use_smallest_local;
  AMQP_VALUE *items_local;
  uint32_t size_local;
  uint32_t count_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  if (use_smallest) {
    iVar1 = output_byte(encoder_output,context,(char)size + '\x01');
    if ((iVar1 == 0) && (iVar1 = output_byte(encoder_output,context,(uchar)count), iVar1 == 0)) {
      i._0_4_ = 0;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_array_value",0x10a0,1,"Could not encode small array header");
      }
      i._0_4_ = 0x10a1;
    }
  }
  else {
    iVar1 = size + 4;
    iVar2 = output_byte(encoder_output,context,(uchar)((uint)iVar1 >> 0x18));
    if (((((iVar2 == 0) &&
          (iVar2 = output_byte(encoder_output,context,(uchar)((uint)iVar1 >> 0x10)), iVar2 == 0)) &&
         (iVar2 = output_byte(encoder_output,context,(uchar)((uint)iVar1 >> 8)), iVar2 == 0)) &&
        ((iVar1 = output_byte(encoder_output,context,(uchar)iVar1), iVar1 == 0 &&
         (iVar1 = output_byte(encoder_output,context,(uchar)(count >> 0x18)), iVar1 == 0)))) &&
       ((iVar1 = output_byte(encoder_output,context,(uchar)(count >> 0x10)), iVar1 == 0 &&
        ((iVar1 = output_byte(encoder_output,context,(uchar)(count >> 8)), iVar1 == 0 &&
         (iVar1 = output_byte(encoder_output,context,(uchar)count), iVar1 == 0)))))) {
      i._0_4_ = 0;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_array_value",0x10b8,1,"Could not encode large array header");
      }
      i._0_4_ = 0x10b9;
    }
  }
  if ((int)i == 0) {
    l_2._7_1_ = true;
    for (l = (LOGGER_LOG)0x0; l < (LOGGER_LOG)(ulong)count; l = l + 1) {
      iVar1 = amqpvalue_encode_array_item(items[(long)l],l_2._7_1_,encoder_output,context);
      if (iVar1 != 0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"encode_array_value",0x10ca,1,"Failed encoding element %u of the array",(int)l)
          ;
        }
        break;
      }
      l_2._7_1_ = false;
    }
    if (l < (LOGGER_LOG)(ulong)count) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_array_value",0x10d2,1,"Could not encode array");
      }
      i._0_4_ = 0x10d3;
    }
    else {
      i._0_4_ = 0;
    }
  }
  return (int)i;
}

Assistant:

static int encode_array_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint32_t count, uint32_t size, AMQP_VALUE* items, bool use_smallest)
{
    int result;
    size_t i;

    if (use_smallest)
    {
        size++;

        /* Codes_SRS_AMQPVALUE_01_306: [<encoding name="map8" code="0xE0" category="compound" width="1" label="up to 2^8 - 1 octets of encoded map data"/>] */
        if ((output_byte(encoder_output, context, (size & 0xFF)) != 0) ||
            (output_byte(encoder_output, context, (count & 0xFF)) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode small array header");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        size += 4;

        /* Codes_SRS_AMQPVALUE_01_307: [<encoding name="map32" code="0xF0" category="compound" width="4" label="up to 2^32 - 1 octets of encoded map data"/>] */
        if ((output_byte(encoder_output, context, (size >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, size & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (count >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (count >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (count >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, count & 0xFF) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode large array header");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    if (result == 0)
    {
        bool first_element = true;

        for (i = 0; i < count; i++)
        {
            if (amqpvalue_encode_array_item(items[i], first_element, encoder_output, context) != 0)
            {
                LogError("Failed encoding element %u of the array", (unsigned int)i);
                break;
            }
            first_element = false;
        }

        if (i < count)
        {
            LogError("Could not encode array");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}